

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionError.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::PositionError::SetVerticalError(PositionError *this,KFIXED16_8 *VE)

{
  DataTypeBase local_28;
  short local_20;
  KFIXED<short,_(unsigned_char)__b_> local_18;
  
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00228398;
  local_20 = VE->m_Val;
  KFIXED<short,_(unsigned_char)'\b'>::operator=(&local_18,&this->m_VertErr);
  DataTypeBase::~DataTypeBase(&local_18.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_28);
  return;
}

Assistant:

PositionError::~PositionError()
{
}